

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Client::show_client_details(Client *this)

{
  ostream *poVar1;
  char *pcVar2;
  allocator local_31;
  string local_30 [8];
  string client_gender;
  Client *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nClient name: ");
  std::operator<<(poVar1,this->name);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nBirthdate: ");
  std::operator<<(poVar1,this->bdate);
  pcVar2 = "male";
  if ((this->gender & 1U) != 0) {
    pcVar2 = "female";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar2,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar1 = std::operator<<((ostream *)&std::cout,"\nGender: ");
  std::operator<<(poVar1,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Client::show_client_details() {
    std::cout<<"\nClient name: "<<name;
    std::cout<<"\nBirthdate: " << bdate;
    std::string client_gender = (gender==0) ? "male": "female";
    std::cout<<"\nGender: "<<client_gender;

}